

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined1 auVar1 [8];
  _func_int **pp_Var2;
  undefined8 uVar3;
  HttpOutputStream *pHVar4;
  PromiseNode *pPVar5;
  undefined4 in_register_00000034;
  undefined1 *puVar6;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  Promise<void> promise;
  String header;
  undefined1 local_78 [8];
  _func_int **pp_Stack_70;
  PromiseArena *local_68;
  undefined1 local_58 [24];
  PromiseNode *pPStack_40;
  undefined8 *local_38;
  ArrayPtr<const_char> local_30;
  
  if (__n == 0) {
    kj::_::readyNow();
    (this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)local_78;
  }
  else {
    hex((CappedArray<char,_17UL> *)local_78,__n);
    local_58._0_8_ = &pp_Stack_70;
    local_58._8_8_ = local_78;
    local_30.ptr = "\r\n";
    local_30.size_ = 2;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)(local_58 + 0x10),(_ *)local_58,&local_30,(ArrayPtr<const_char> *)local_78)
    ;
    local_78 = (undefined1  [8])
               kj::_::HeapArrayDisposer::allocateImpl
                         (0x10,3,3,kj::_::HeapArrayDisposer::
                                   Allocate_<kj::ArrayPtr<const_unsigned_char>_>::construct,
                          ArrayDisposer::Dispose_<kj::ArrayPtr<const_unsigned_char>_>::destruct);
    pp_Stack_70 = (_func_int **)0x3;
    local_68 = (PromiseArena *)&kj::_::HeapArrayDisposer::instance;
    pPVar5 = pPStack_40;
    if (pPStack_40 != (PromiseNode *)0x0) {
      pPVar5 = (PromiseNode *)local_58._16_8_;
    }
    puVar6 = (undefined1 *)0x0;
    if (pPStack_40 != (PromiseNode *)0x0) {
      puVar6 = (undefined1 *)((long)&pPStack_40[-1].super_PromiseArenaMember.arena + 7);
    }
    *(PromiseNode **)local_78 = pPVar5;
    *(undefined1 **)((long)local_78 + 8) = puVar6;
    *(void **)((long)local_78 + 0x10) = __buf;
    *(size_t *)((long)local_78 + 0x18) = __n;
    *(undefined2 **)((long)local_78 + 0x20) = &kj::_::ByteLiteral<3ul>;
    *(long *)((long)local_78 + 0x28) = 2;
    pHVar4 = HttpEntityBodyWriter::getInner
                       ((HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd));
    pieces.size_ = (size_t)local_78;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar4;
    HttpOutputStream::writeBodyData((HttpOutputStream *)local_58,pieces);
    Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Promise<void> *)this,(String *)local_58,
               (Array<kj::ArrayPtr<const_unsigned_char>_> *)(local_58 + 0x10));
    uVar3 = local_58._0_8_;
    if ((Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)local_58._0_8_ !=
        (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
      local_58._0_8_ = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
    pp_Var2 = pp_Stack_70;
    auVar1 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      local_78 = (undefined1  [8])0x0;
      pp_Stack_70 = (_func_int **)0x0;
      (*(code *)**(undefined8 **)local_68->bytes)(local_68,auVar1,0x10,pp_Var2,pp_Var2,0);
    }
    pPVar5 = pPStack_40;
    uVar3 = local_58._16_8_;
    if ((PromiseNode *)local_58._16_8_ != (PromiseNode *)0x0) {
      local_58._16_8_ = (PromiseNode *)0x0;
      pPStack_40 = (PromiseNode *)0x0;
      (**(code **)*local_38)(local_38,uVar3,1,pPVar5,pPVar5,0);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(buffer.size()), "\r\n");
    auto parts = kj::heapArray<ArrayPtr<const byte>>(3);
    parts[0] = header.asBytes();
    parts[1] = buffer;
    parts[2] = "\r\n"_kjb;

    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }